

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderRendering.cpp
# Opt level: O0

void __thiscall glcts::GeometryShaderRenderingCase::initTest(GeometryShaderRenderingCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  GLuint GVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  TestError *pTVar7;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  GLuint local_174;
  GLuint local_164;
  GLuint local_154;
  uint local_12c;
  GLuint *local_128;
  GLuint *local_120;
  GLuint *local_118;
  char *local_100;
  char *vs_code_ptr;
  char *gs_code_ptr;
  char *fs_code_ptr;
  void *unordered_elements_data;
  uint unordered_elements_bo_size;
  GLuint unordered_elements_bo_id;
  void *unordered_arrays_data;
  uint unordered_arrays_bo_size;
  GLuint unordered_arrays_bo_id;
  void *raw_arrays_data;
  uint raw_arrays_bo_size;
  GLuint raw_arrays_bo_id;
  GLuint *to_id_ptr;
  uint to_width;
  uint to_height;
  GLuint *read_fbo_id_ptr;
  GLuint *draw_fbo_id_ptr;
  string local_90 [7];
  bool is_instanced;
  string vs_code;
  uint local_68;
  uint n_instances;
  uint n;
  string local_58 [8];
  string gs_code;
  string fs_code;
  Functions *gl;
  GeometryShaderRenderingCase *this_local;
  long lVar6;
  
  pRVar5 = deqp::Context::getRenderContext(this->m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[9])
            ((undefined1 *)((long)&gs_code.field_2 + 8));
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[10])(local_58);
  vs_code.field_2._12_4_ =
       (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[5])();
  (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x15])(local_90);
  (**(code **)(lVar6 + 0xff0))(0xd05,1);
  (**(code **)(lVar6 + 0xff0))(0xcf5,1);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_instanced_raw_arrays_bo_id);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_instanced_unordered_arrays_bo_id);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_instanced_unordered_elements_bo_id);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_noninstanced_raw_arrays_bo_id);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_noninstanced_unordered_arrays_bo_id);
  (**(code **)(lVar6 + 0x6c8))(1,&this->m_noninstanced_unordered_elements_bo_id);
  local_68 = 0;
  while( true ) {
    if (1 < local_68) {
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"Could not configure test buffer objects",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3af);
      (**(code **)(lVar6 + 0x708))(1,&this->m_vao_id);
      (**(code **)(lVar6 + 0xd8))(this->m_vao_id);
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"Could not generate & bind a vertex array object",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3b5);
      gs_code_ptr = (char *)std::__cxx11::string::c_str();
      vs_code_ptr = (char *)std::__cxx11::string::c_str();
      local_100 = (char *)std::__cxx11::string::c_str();
      GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b30);
      this->m_fs_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3f0))((this->super_TestCaseBase).m_glExtTokens.GEOMETRY_SHADER)
      ;
      this->m_gs_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3c8))();
      this->m_po_id = GVar4;
      GVar4 = (**(code **)(lVar6 + 0x3f0))(0x8b31);
      this->m_vs_id = GVar4;
      dVar3 = (**(code **)(lVar6 + 0x800))();
      glu::checkError(dVar3,"Could not create shader/program objects",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                      ,0x3c1);
      bVar1 = TestCaseBase::buildProgram
                        (&this->super_TestCaseBase,this->m_po_id,this->m_fs_id,1,&gs_code_ptr,
                         this->m_gs_id,1,&vs_code_ptr,this->m_vs_id,1,&local_100,(bool *)0x0);
      if (!bVar1) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Could not build shader program",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                   ,0x3c5);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      GVar4 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"renderingTargetSize");
      this->m_renderingTargetSize_uniform_location = GVar4;
      GVar4 = (**(code **)(lVar6 + 0xb48))(this->m_po_id,"singleRenderingTargetSize");
      this->m_singleRenderingTargetSize_uniform_location = GVar4;
      std::__cxx11::string::~string(local_90);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string((string *)(gs_code.field_2._M_local_buf + 8));
      return;
    }
    draw_fbo_id_ptr._7_1_ = local_68 == 1;
    if ((bool)draw_fbo_id_ptr._7_1_) {
      local_118 = &this->m_instanced_fbo_id;
    }
    else {
      local_118 = &this->m_fbo_id;
    }
    read_fbo_id_ptr = local_118;
    if ((bool)draw_fbo_id_ptr._7_1_) {
      local_120 = &this->m_instanced_read_fbo_id;
    }
    else {
      local_120 = &this->m_read_fbo_id;
    }
    _to_width = local_120;
    to_id_ptr._4_4_ = 0;
    to_id_ptr._0_4_ = 0;
    if ((bool)draw_fbo_id_ptr._7_1_) {
      local_128 = &this->m_instanced_to_id;
    }
    else {
      local_128 = &this->m_to_id;
    }
    _raw_arrays_bo_size = local_128;
    if (local_68 == 0) {
      local_12c = 1;
    }
    else {
      local_12c = vs_code.field_2._12_4_;
    }
    (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xd])
              (this,(ulong)local_12c,&to_id_ptr,(long)&to_id_ptr + 4);
    (**(code **)(lVar6 + 0x6f8))(1,_raw_arrays_bo_size);
    (**(code **)(lVar6 + 0xb8))(0xde1,*_raw_arrays_bo_size);
    (**(code **)(lVar6 + 0x1380))(0xde1,1,0x8058,to_id_ptr._0_4_,to_id_ptr._4_4_);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not configure a 2D texture object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,0x37c);
    (**(code **)(lVar6 + 0x6d0))(1,read_fbo_id_ptr);
    (**(code **)(lVar6 + 0x78))(0x8ca9,*read_fbo_id_ptr);
    (**(code **)(lVar6 + 0x6a0))(0x8ca9,0x8ce0,0xde1,*_raw_arrays_bo_size,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not configure draw framebuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,900);
    iVar2 = (**(code **)(lVar6 + 0x170))(0x8ca9);
    if (iVar2 != 0x8cd5) break;
    (**(code **)(lVar6 + 0x6d0))(1,_to_width);
    (**(code **)(lVar6 + 0x78))(0x8ca8,*_to_width);
    (**(code **)(lVar6 + 0x6a0))(0x8ca8,0x8ce0,0xde1,*_raw_arrays_bo_size,0);
    dVar3 = (**(code **)(lVar6 + 0x800))();
    glu::checkError(dVar3,"Could not configure read framebuffer object",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                    ,0x391);
    iVar2 = (**(code **)(lVar6 + 0x170))(0x8ca8);
    if (iVar2 != 0x8cd5) {
      pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar7,"Read framebuffer is reported to be incomplete",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
                 ,0x395);
      __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    if ((draw_fbo_id_ptr._7_1_ & 1) == 0) {
      local_154 = this->m_noninstanced_raw_arrays_bo_id;
    }
    else {
      local_154 = this->m_instanced_raw_arrays_bo_id;
    }
    raw_arrays_data._4_4_ = local_154;
    raw_arrays_data._0_4_ =
         (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xb])
                   (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xc])
                      (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    _unordered_arrays_bo_size = CONCAT44(extraout_var_00,iVar2);
    if ((draw_fbo_id_ptr._7_1_ & 1) == 0) {
      local_164 = this->m_noninstanced_unordered_arrays_bo_id;
    }
    else {
      local_164 = this->m_instanced_unordered_arrays_bo_id;
    }
    unordered_arrays_data._4_4_ = local_164;
    unordered_arrays_data._0_4_ =
         (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xe])
                   (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0xf])
                      (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    _unordered_elements_bo_size = CONCAT44(extraout_var_01,iVar2);
    if ((draw_fbo_id_ptr._7_1_ & 1) == 0) {
      local_174 = this->m_noninstanced_unordered_elements_bo_id;
    }
    else {
      local_174 = this->m_instanced_unordered_elements_bo_id;
    }
    unordered_elements_data._4_4_ = local_174;
    unordered_elements_data._0_4_ =
         (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x10])
                   (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    iVar2 = (*(this->super_TestCaseBase).super_TestCase.super_TestNode._vptr_TestNode[0x11])
                      (this,(ulong)(draw_fbo_id_ptr._7_1_ & 1));
    fs_code_ptr = (char *)CONCAT44(extraout_var_02,iVar2);
    (**(code **)(lVar6 + 0x40))(0x8892,raw_arrays_data._4_4_);
    (**(code **)(lVar6 + 0x150))(0x8892,(int)raw_arrays_data,_unordered_arrays_bo_size,0x88e6);
    (**(code **)(lVar6 + 0x40))(0x8892,unordered_arrays_data._4_4_);
    (**(code **)(lVar6 + 0x150))
              (0x8892,(int)unordered_arrays_data,_unordered_elements_bo_size,0x88e6);
    (**(code **)(lVar6 + 0x40))(0x8892,unordered_elements_data._4_4_);
    (**(code **)(lVar6 + 0x150))(0x8892,(int)unordered_elements_data,fs_code_ptr,0x88e6);
    local_68 = local_68 + 1;
  }
  pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar7,"Draw framebuffer is reported to be incomplete",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderRendering.cpp"
             ,0x388);
  __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void GeometryShaderRenderingCase::initTest()
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Retrieve derivative class' properties */
	std::string  fs_code	 = getFragmentShaderCode();
	std::string  gs_code	 = getGeometryShaderCode();
	unsigned int n			 = 0;
	unsigned int n_instances = getAmountOfDrawInstances();
	std::string  vs_code	 = getVertexShaderCode();

	/* Set pixel storage properties before we continue */
	gl.pixelStorei(GL_PACK_ALIGNMENT, 1);
	gl.pixelStorei(GL_UNPACK_ALIGNMENT, 1);

	/* Create buffer objects the derivative implementation will fill with data */
	gl.genBuffers(1, &m_instanced_raw_arrays_bo_id);
	gl.genBuffers(1, &m_instanced_unordered_arrays_bo_id);
	gl.genBuffers(1, &m_instanced_unordered_elements_bo_id);
	gl.genBuffers(1, &m_noninstanced_raw_arrays_bo_id);
	gl.genBuffers(1, &m_noninstanced_unordered_arrays_bo_id);
	gl.genBuffers(1, &m_noninstanced_unordered_elements_bo_id);

	/* Set up a separate set of objects, that will be used for testing instanced and non-instanced draw calls */
	for (n = 0; n < 2 /* non-/instanced draw calls */; ++n)
	{
		bool is_instanced = (n == 1);

		glw::GLuint* draw_fbo_id_ptr = !is_instanced ? &m_fbo_id : &m_instanced_fbo_id;
		glw::GLuint* read_fbo_id_ptr = (!is_instanced) ? &m_read_fbo_id : &m_instanced_read_fbo_id;
		unsigned int to_height		 = 0;
		unsigned int to_width		 = 0;
		glw::GLuint* to_id_ptr		 = (!is_instanced) ? &m_to_id : &m_instanced_to_id;

		/* n == 0: non-instanced draw calls, instanced otherwise */
		getRenderTargetSize((n == 0) ? 1 : n_instances, &to_width, &to_height);

		/* Create a texture object we will be rendering to */
		gl.genTextures(1, to_id_ptr);
		gl.bindTexture(GL_TEXTURE_2D, *to_id_ptr);
		gl.texStorage2D(GL_TEXTURE_2D, 1 /* levels */, GL_RGBA8, to_width, to_height);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure a 2D texture object");

		/* Create and configure a framebuffer object that will be used for rendering */
		gl.genFramebuffers(1, draw_fbo_id_ptr);
		gl.bindFramebuffer(GL_DRAW_FRAMEBUFFER, *draw_fbo_id_ptr);

		gl.framebufferTexture2D(GL_DRAW_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *to_id_ptr, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure draw framebuffer object");

		if (gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		{
			TCU_FAIL("Draw framebuffer is reported to be incomplete");
		} /* if (gl.checkFramebufferStatus(GL_DRAW_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) */

		/* Create and bind a FBO we will use for reading rendered data */
		gl.genFramebuffers(1, read_fbo_id_ptr);
		gl.bindFramebuffer(GL_READ_FRAMEBUFFER, *read_fbo_id_ptr);

		gl.framebufferTexture2D(GL_READ_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_TEXTURE_2D, *to_id_ptr, 0 /* level */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure read framebuffer object");

		if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE)
		{
			TCU_FAIL("Read framebuffer is reported to be incomplete");
		} /* if (gl.checkFramebufferStatus(GL_READ_FRAMEBUFFER) != GL_FRAMEBUFFER_COMPLETE) */

		/* Fill the iteration-specific buffer objects with data */
		glw::GLuint  raw_arrays_bo_id = (is_instanced) ? m_instanced_raw_arrays_bo_id : m_noninstanced_raw_arrays_bo_id;
		unsigned int raw_arrays_bo_size = getRawArraysDataBufferSize(is_instanced);
		const void*  raw_arrays_data	= getRawArraysDataBuffer(is_instanced);
		glw::GLuint  unordered_arrays_bo_id =
			(is_instanced) ? m_instanced_unordered_arrays_bo_id : m_noninstanced_unordered_arrays_bo_id;
		unsigned int unordered_arrays_bo_size = getUnorderedArraysDataBufferSize(is_instanced);
		const void*  unordered_arrays_data	= getUnorderedArraysDataBuffer(is_instanced);
		glw::GLuint  unordered_elements_bo_id =
			(is_instanced) ? m_instanced_unordered_elements_bo_id : m_noninstanced_unordered_elements_bo_id;
		unsigned int unordered_elements_bo_size = getUnorderedElementsDataBufferSize(is_instanced);
		const void*  unordered_elements_data	= getUnorderedElementsDataBuffer(is_instanced);

		gl.bindBuffer(GL_ARRAY_BUFFER, raw_arrays_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, raw_arrays_bo_size, raw_arrays_data, GL_STATIC_COPY);

		gl.bindBuffer(GL_ARRAY_BUFFER, unordered_arrays_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, unordered_arrays_bo_size, unordered_arrays_data, GL_STATIC_COPY);

		gl.bindBuffer(GL_ARRAY_BUFFER, unordered_elements_bo_id);
		gl.bufferData(GL_ARRAY_BUFFER, unordered_elements_bo_size, unordered_elements_data, GL_STATIC_COPY);
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not configure test buffer objects");

	/* Create and bind a VAO */
	gl.genVertexArrays(1, &m_vao_id);
	gl.bindVertexArray(m_vao_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not generate & bind a vertex array object");

	/* Create and configure program & shader objects that will be used for the test case */
	const char* fs_code_ptr = fs_code.c_str();
	const char* gs_code_ptr = gs_code.c_str();
	const char* vs_code_ptr = vs_code.c_str();

	m_fs_id = gl.createShader(GL_FRAGMENT_SHADER);
	m_gs_id = gl.createShader(m_glExtTokens.GEOMETRY_SHADER);
	m_po_id = gl.createProgram();
	m_vs_id = gl.createShader(GL_VERTEX_SHADER);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create shader/program objects");

	if (!buildProgram(m_po_id, m_fs_id, 1, &fs_code_ptr, m_gs_id, 1, &gs_code_ptr, m_vs_id, 1, &vs_code_ptr))
	{
		TCU_FAIL("Could not build shader program");
	}

	/* Retrieve uniform locations */
	m_renderingTargetSize_uniform_location		 = gl.getUniformLocation(m_po_id, "renderingTargetSize");
	m_singleRenderingTargetSize_uniform_location = gl.getUniformLocation(m_po_id, "singleRenderingTargetSize");
}